

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

int fio_rw_hook_replace_unsafe(intptr_t uuid,fio_rw_hook_s *rw_hooks,void *udata)

{
  char *pcVar1;
  char cVar2;
  fio_data_s *pfVar3;
  int iVar4;
  long lVar5;
  fio_lock_i ret;
  fio_lock_i ret_1;
  
  if (rw_hooks->read == (_func_ssize_t_intptr_t_void_ptr_void_ptr_size_t *)0x0) {
    rw_hooks->read = fio_hooks_default_read;
  }
  if (rw_hooks->write == (_func_ssize_t_intptr_t_void_ptr_void_ptr_size_t *)0x0) {
    rw_hooks->write = fio_hooks_default_write;
  }
  if (rw_hooks->flush == (_func_ssize_t_intptr_t_void_ptr *)0x0) {
    rw_hooks->flush = fio_hooks_default_flush;
  }
  if (rw_hooks->before_close == (_func_ssize_t_intptr_t_void_ptr *)0x0) {
    rw_hooks->before_close = fio_hooks_default_before_close;
  }
  iVar4 = (int)((ulong)uuid >> 8);
  if (rw_hooks->cleanup == (_func_void_void_ptr *)0x0) {
    rw_hooks->cleanup = fio_hooks_default_cleanup;
  }
  lVar5 = (long)iVar4 * 0xa8;
  LOCK();
  pcVar1 = (char *)((long)fio_data + lVar5 + 0x6e);
  cVar2 = *pcVar1;
  *pcVar1 = '\x01';
  pfVar3 = fio_data;
  UNLOCK();
  if (CONCAT41(iVar4,*(undefined1 *)((long)fio_data + lVar5 + 0x6d)) == uuid) {
    *(fio_rw_hook_s **)((long)fio_data + lVar5 + 0xa8) = rw_hooks;
    *(void **)((long)pfVar3 + lVar5 + 0xb0) = udata;
    iVar4 = 0;
  }
  else {
    iVar4 = -1;
  }
  if (cVar2 != '\0') {
    return iVar4;
  }
  LOCK();
  *(undefined1 *)((long)pfVar3 + lVar5 + 0x6e) = 0;
  UNLOCK();
  return iVar4;
}

Assistant:

int fio_rw_hook_replace_unsafe(intptr_t uuid, fio_rw_hook_s *rw_hooks,
                               void *udata) {
  int replaced = -1;
  uint8_t was_locked;
  intptr_t fd = fio_uuid2fd(uuid);
  if (!rw_hooks->read)
    rw_hooks->read = fio_hooks_default_read;
  if (!rw_hooks->write)
    rw_hooks->write = fio_hooks_default_write;
  if (!rw_hooks->flush)
    rw_hooks->flush = fio_hooks_default_flush;
  if (!rw_hooks->before_close)
    rw_hooks->before_close = fio_hooks_default_before_close;
  if (!rw_hooks->cleanup)
    rw_hooks->cleanup = fio_hooks_default_cleanup;
  /* protect against some fulishness... but not all of it. */
  was_locked = fio_trylock(&fd_data(fd).sock_lock);
  if (fd2uuid(fd) == uuid) {
    fd_data(fd).rw_hooks = rw_hooks;
    fd_data(fd).rw_udata = udata;
    replaced = 0;
  }
  if (!was_locked)
    fio_unlock(&fd_data(fd).sock_lock);
  return replaced;
}